

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void DDecalStretcher::InPlaceConstructor(void *mem)

{
  DDecalThinker::DDecalThinker((DDecalThinker *)mem);
  *(undefined ***)mem = &PTR_StaticType_006ecda0;
  return;
}

Assistant:

void DDecalStretcher::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("starttime", TimeToStart)
		("endtime", TimeToStop)
		("goalx", GoalX)
		("startx", StartX)
		("stretchx", bStretchX)
		("goaly", GoalY)
		("starty", StartY)
		("stretchy", bStretchY)
		("started", bStarted);
}